

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filereader.cpp
# Opt level: O1

void __thiscall
indigox::utils::FileReader::GetAllItems
          (FileReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_items)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  String next_item;
  String line;
  ifstream infile;
  istringstream itemiser;
  value_type local_3f8;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8;
  undefined7 uStack_3c7;
  long local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  local_3d8 = &local_3c8;
  local_3d0 = 0;
  local_3c8 = 0;
  std::ifstream::ifstream(local_3b8);
  std::ifstream::open((string *)local_3b8,(_Ios_Openmode)this);
  if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 5) != 0) {
LAB_00111770:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file: ",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(1);
  }
  this = (FileReader *)&std::__cxx11::istringstream::VTT;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_3b8[0] + -0x18) + (char)(string *)local_3b8)
    ;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3b8,(string *)&local_3d8,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(local_3b8);
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8,CONCAT71(uStack_3c7,local_3c8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                 local_3f8.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3d8,_S_in);
    while( true ) {
      piVar2 = std::operator>>((istream *)local_1b0,(string *)&local_3f8);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (local_3f8._M_string_length == 0) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
        goto LAB_00111770;
      }
      if (*local_3f8._M_dataplus._M_p == '#') break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(out_items,&local_3f8);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
  } while( true );
}

Assistant:

void FileReader::GetAllItems(std::vector<String> &out_items)
    {
      String next_item, line;
      std::ifstream infile;
      infile.open(path_);
      
      /// @todo Throw an exception when can't open file.
      if (!infile) {
        std::cerr << "Unable to open file: " << path_ << std::endl;
        std::exit(1);
      }
      
      while (std::getline(infile, line)) {
        std::istringstream itemiser(line);
        while (itemiser >> next_item) {
          if (next_item.at(0) == '#') break;
          out_items.push_back(next_item);
        }
      }
      
      infile.close();
    }